

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall sznet::net::Channel::handleEvent(Channel *this,Timestamp receiveTime)

{
  bool bVar1;
  shared_ptr<void> local_38;
  undefined1 local_28 [8];
  shared_ptr<void> guard;
  Channel *this_local;
  Timestamp receiveTime_local;
  
  guard.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)local_28);
  if ((this->m_tied & 1U) == 0) {
    handleEventWithGuard(this,receiveTime);
  }
  else {
    std::weak_ptr<void>::lock((weak_ptr<void> *)&local_38);
    std::shared_ptr<void>::operator=((shared_ptr<void> *)local_28,&local_38);
    std::shared_ptr<void>::~shared_ptr(&local_38);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    if (bVar1) {
      handleEventWithGuard(this,receiveTime);
    }
  }
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_28);
  return;
}

Assistant:

void Channel::handleEvent(Timestamp receiveTime)
{
	std::shared_ptr<void> guard;
	if (m_tied)
	{
		guard = m_tie.lock();
		if (guard)
		{
			handleEventWithGuard(receiveTime);
		}
	}
	else
	{
		handleEventWithGuard(receiveTime);
	}
}